

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_span.h
# Opt level: O3

reference __thiscall S2PointLoopSpan::operator[](S2PointLoopSpan *this,int i)

{
  size_type sVar1;
  uint uVar2;
  ulong uVar3;
  S2LogMessage local_10;
  
  if (i < 0) {
    S2LogMessage::S2LogMessage
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x32,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_10.stream_,"Check failed: (i) >= (0) ",0x19);
  }
  else {
    sVar1 = (this->super_S2PointSpan).len_;
    if ((ulong)(uint)i < sVar1 * 2) {
      uVar2 = i - (int)sVar1;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 0) {
        uVar3 = (ulong)(uint)i;
      }
      return (this->super_S2PointSpan).ptr_ + uVar3;
    }
    S2LogMessage::S2LogMessage
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x33,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_10.stream_,"Check failed: (i) < (2 * size()) ",0x21);
  }
  abort();
}

Assistant:

reference operator[](int i) const noexcept {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * size());
    int j = i - static_cast<int>(size());
    return S2PointSpan::operator[](j < 0 ? i : j);
  }